

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O2

_Bool savefile_load(char *path,_Bool cheat_death)

{
  player *ppVar1;
  uint32_t uVar2;
  blockinfo *pbVar3;
  _Bool _Var4;
  errr eVar5;
  int iVar6;
  ang_file *f;
  char *pcVar7;
  blockinfo *__s2;
  blockheader bStack_48;
  
  safe_setuid_grab();
  f = file_open(path,MODE_READ,FTYPE_TEXT);
  safe_setuid_drop();
  if (f == (ang_file *)0x0) {
    note("Couldn\'t open savefile.");
    _Var4 = false;
  }
  else {
    _Var4 = check_header(f);
    if (_Var4) {
      do {
        eVar5 = next_blockheader(f,&bStack_48);
        uVar2 = bStack_48.version;
        if (eVar5 != 0) {
          if (eVar5 != -1) {
            _Var4 = true;
            goto LAB_001c04c1;
          }
          pcVar7 = "Savefile is corrupted -- block header mangled.";
          goto LAB_001c04ba;
        }
        pbVar3 = loaders;
        do {
          __s2 = pbVar3;
          if (__s2->name[0] == '\0') goto LAB_001c04a7;
          iVar6 = strcmp(bStack_48.name,__s2->name);
          pbVar3 = __s2 + 1;
        } while ((iVar6 != 0) || (uVar2 != 1));
        if (__s2->loader == (loader_t)0x0) {
LAB_001c04a7:
          note("Savefile block can\'t be read.");
          pcVar7 = "Maybe try and load the savefile in an earlier version of Angband.";
          goto LAB_001c04ba;
        }
        _Var4 = load_block(f,&bStack_48,__s2->loader);
      } while (_Var4);
      _Var4 = false;
      pcVar7 = format("Savefile corrupted - Couldn\'t load block %s",&bStack_48);
      note(pcVar7);
    }
    else {
      pcVar7 = "Savefile is corrupted -- incorrect file header.";
LAB_001c04ba:
      note(pcVar7);
      _Var4 = false;
    }
LAB_001c04c1:
    file_close(f);
    ppVar1 = player;
    if ((cheat_death & player->is_dead) == 1) {
      player->is_dead = false;
      ppVar1->chp = ppVar1->mhp;
      *(byte *)&ppVar1->noscore = (byte)ppVar1->noscore | 2;
    }
    character_generated = true;
    ppVar1->upkeep->playing = true;
  }
  return _Var4;
}

Assistant:

bool savefile_load(const char *path, bool cheat_death)
{
	bool ok;
	ang_file *f;

	safe_setuid_grab();
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	safe_setuid_drop();
	if (!f) {
		note("Couldn't open savefile.");
		return false;
	}

	ok = try_load(f, loaders);
	file_close(f);

	if (player->is_dead && cheat_death) {
			player->is_dead = false;
			player->chp = player->mhp;
			player->noscore |= NOSCORE_WIZARD;
	}

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	return ok;
}